

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O1

size_t Jupiter_base64encode(void *data_buf,size_t dataLength,char *result)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  char *__s;
  
  __s = result;
  if (dataLength != 0) {
    uVar1 = 2;
    do {
      uVar3 = (uint)*(byte *)((long)data_buf + (uVar1 - 2)) << 0x10;
      if (uVar1 - 1 < dataLength) {
        uVar3 = uVar3 | (uint)*(byte *)((long)data_buf + (uVar1 - 1)) << 8;
      }
      if (uVar1 < dataLength) {
        uVar3 = uVar3 + *(byte *)((long)data_buf + uVar1);
      }
      *__s = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [uVar3 >> 0x12 & 0x3f];
      __s[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [uVar3 >> 0xc & 0x3f];
      if (uVar1 - 1 < dataLength) {
        __s[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [uVar3 >> 6 & 0x3f];
        __s = __s + 3;
      }
      else {
        __s = __s + 2;
      }
      if (uVar1 < dataLength) {
        *__s = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar3 & 0x3f];
        __s = __s + 1;
      }
      uVar2 = uVar1 + 1;
      uVar1 = uVar1 + 3;
    } while (uVar2 < dataLength);
  }
  if (dataLength != (dataLength / 3) * 3) {
    uVar1 = (ulong)(((int)(dataLength / 3) * 3 - (int)dataLength) + 2);
    memset(__s,0x3d,uVar1 + 1);
    __s = __s + uVar1 + 1;
  }
  *__s = '\0';
  return (long)__s - (long)result;
}

Assistant:

size_t Jupiter_base64encode(const void *data_buf, size_t dataLength, char *result)
{
	const char base64chars[] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
	const uint8_t *data = (const uint8_t *)data_buf;
	char *resultPtr = result;
	uint32_t n = 0;
	int padCount = dataLength % 3;
	uint8_t n0, n1, n2, n3;

	/* increment over the length of the string, three characters at a time */
	for (size_t x = 0; x < dataLength; x += 3)
	{
		/* these three 8-bit (ASCII) characters become one 24-bit number */
		n = data[x] << 16;

		if ((x + 1) < dataLength) n += data[x + 1] << 8;
		if ((x + 2) < dataLength) n += data[x + 2];

		/* this 24-bit number gets separated into four 6-bit numbers */
		n0 = (uint8_t)(n >> 18) & 63;
		n1 = (uint8_t)(n >> 12) & 63;
		n2 = (uint8_t)(n >> 6) & 63;
		n3 = (uint8_t)n & 63;

		/*
		* if we have one byte available, then its encoding is spread
		* out over two characters
		*/
		*resultPtr = base64chars[n0];
		resultPtr++;
		*resultPtr = base64chars[n1];
		resultPtr++;

		/*
		* if we have only two bytes available, then their encoding is
		* spread out over three chars
		*/
		if ((x + 1) < dataLength)
		{
			*resultPtr = base64chars[n2];
			resultPtr++;
		}

		/*
		* if we have all three bytes available, then their encoding is spread
		* out over four characters
		*/
		if ((x + 2) < dataLength)
		{
			*resultPtr = base64chars[n3];
			resultPtr++;
		}
	}

	/*
	* create and add padding that is required if we did not have a multiple of 3
	* number of characters available
	*/
	if (padCount > 0)
	{
		while (padCount < 3)
		{
			*resultPtr = '=';
			resultPtr++;
			padCount++;
		}
	}
	*resultPtr = 0;
	return resultPtr - result;
}